

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateBlockingStub
          (ImmutableServiceGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  int iVar2;
  int iVar3;
  MethodDescriptor *method_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar4;
  AlphaNum *a;
  string_view local_178;
  string_view local_168;
  string_view local_158;
  string local_148;
  AlphaNum local_118;
  string local_e8;
  undefined1 local_c8 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  MethodDescriptor *method_1;
  undefined1 auStack_88 [4];
  int i_1;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  MethodDescriptor *local_48;
  MethodDescriptor *method;
  undefined1 auStack_38 [4];
  int i;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "public static BlockingInterface newBlockingStub(\n    com.google.protobuf.BlockingRpcChannel channel) {\n  return new BlockingStub(channel);\n}\n\n"
            );
  protobuf::io::Printer::Print<>(printer,local_28);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,
             "public interface BlockingInterface {");
  protobuf::io::Printer::Print<>(pPVar1,_auStack_38);
  protobuf::io::Printer::Indent(local_18);
  method._4_4_ = 0;
  while( true ) {
    iVar3 = method._4_4_;
    iVar2 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar2 <= iVar3) break;
    local_48 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method._4_4_);
    GenerateBlockingMethodSignature(this,local_18,local_48);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,";\n");
    protobuf::io::Printer::Print<>(pPVar1,local_58);
    method._4_4_ = method._4_4_ + 1;
  }
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"}\n\n");
  protobuf::io::Printer::Print<>(pPVar1,local_68);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_78,"private static final class BlockingStub implements BlockingInterface {\n");
  protobuf::io::Printer::Print<>(pPVar1,local_78);
  protobuf::io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88,
             "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.BlockingRpcChannel channel;\n"
            );
  protobuf::io::Printer::Print<>(pPVar1,_auStack_88);
  method_1._4_4_ = 0;
  while( true ) {
    iVar3 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar3 <= method_1._4_4_) break;
    method_00 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method_1._4_4_)
    ;
    GenerateBlockingMethodSignature(this,local_18,method_00);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value + 0x18)," {\n");
    protobuf::io::Printer::Print<>(pPVar1,stack0xffffffffffffff58);
    protobuf::io::Printer::Indent(local_18);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_c8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_118,method_1._4_4_);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_e8,(lts_20250127 *)&local_118,a);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_c8,(key_arg<char[6]> *)0x1d2f5b9);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    GetOutput_abi_cxx11_(&local_148,this,method_00);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)local_c8,(key_arg<char[7]> *)0x1e2275d);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_158,
               "return ($output$) channel.callBlockingMethod(\n  getDescriptor().getMethods().get($index$),\n  controller,\n  request,\n  $output$.getDefaultInstance());\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar1,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_c8,local_158);
    protobuf::io::Printer::Outdent(local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"}\n\n");
    protobuf::io::Printer::Print<>(pPVar1,local_168);
    absl::lts_20250127::
    flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c8);
    method_1._4_4_ = method_1._4_4_ + 1;
  }
  protobuf::io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,"}\n");
  protobuf::io::Printer::Print<>(pPVar1,local_178);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateBlockingStub(io::Printer* printer) {
  printer->Print(
      "public static BlockingInterface newBlockingStub(\n"
      "    com.google.protobuf.BlockingRpcChannel channel) {\n"
      "  return new BlockingStub(channel);\n"
      "}\n"
      "\n");

  printer->Print("public interface BlockingInterface {");
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(";\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "private static final class BlockingStub implements BlockingInterface "
      "{\n");
  printer->Indent();

  printer->Print(
      "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n"
      "  this.channel = channel;\n"
      "}\n"
      "\n"
      "private final com.google.protobuf.BlockingRpcChannel channel;\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(" {\n");
    printer->Indent();

    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["index"] = absl::StrCat(i);
    vars["output"] = GetOutput(method);
    printer->Print(vars,
                   "return ($output$) channel.callBlockingMethod(\n"
                   "  getDescriptor().getMethods().get($index$),\n"
                   "  controller,\n"
                   "  request,\n"
                   "  $output$.getDefaultInstance());\n");

    printer->Outdent();
    printer->Print(
        "}\n"
        "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}